

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  int iVar1;
  DescriptorBuilder *in_RSI;
  FileDescriptor *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar2;
  int i;
  uint in_stack_ffffffffffffffbc;
  byte local_35;
  int local_34;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  
  local_35 = 1;
  if (in_RSI != (DescriptorBuilder *)0x0) {
    pVar2 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::insert(in_stack_ffffffffffffffe0,
                     (value_type *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffe8 = pVar2.second;
    local_35 = in_stack_ffffffffffffffe8 ^ 0xff;
  }
  if ((local_35 & 1) == 0) {
    local_34 = 0;
    while( true ) {
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
      if (in_RSI != (DescriptorBuilder *)0x0) {
        iVar1 = FileDescriptor::public_dependency_count((FileDescriptor *)in_RSI);
        in_stack_ffffffffffffffbc = CONCAT13(local_34 < iVar1,(int3)in_stack_ffffffffffffffbc);
      }
      if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
      FileDescriptor::public_dependency(in_RDI,in_stack_ffffffffffffffbc);
      RecordPublicDependencies
                (in_RSI,(FileDescriptor *)
                        CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8));
      local_34 = local_34 + 1;
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == nullptr || !dependencies_.insert(file).second) return;
  for (int i = 0; file != nullptr && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}